

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.h
# Opt level: O0

BBox * __thiscall CMU462::StaticScene::Sphere::get_bbox(Sphere *this)

{
  Vector3D *in_RSI;
  BBox *in_RDI;
  Vector3D *in_stack_ffffffffffffff78;
  Vector3D *this_00;
  BBox *min;
  BBox *in_stack_ffffffffffffff90;
  Vector3D local_40 [2];
  
  min = in_RDI;
  Vector3D::Vector3D(local_40,in_RSI[1].z,in_RSI[1].z,in_RSI[1].z);
  Vector3D::operator-(in_stack_ffffffffffffff78,in_RSI);
  this_00 = (Vector3D *)&in_RSI->z;
  Vector3D::Vector3D((Vector3D *)&stack0xffffffffffffff90,in_RSI[1].z,in_RSI[1].z,in_RSI[1].z);
  Vector3D::operator+(this_00,in_RSI);
  BBox::BBox(in_stack_ffffffffffffff90,&min->max,&in_RDI->max);
  return min;
}

Assistant:

BBox get_bbox() const {
    return BBox(o - Vector3D(r, r, r), o + Vector3D(r, r, r));
  }